

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O3

void __thiscall Assimp::Ogre::Mesh::Reset(Mesh *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Skeleton *this_00;
  VertexData *this_01;
  pointer ppSVar2;
  SubMesh *this_02;
  pointer ppAVar3;
  Animation *pAVar4;
  pointer pcVar5;
  pointer ppPVar6;
  Pose *pPVar7;
  SubMesh **mesh;
  pointer ppSVar8;
  pointer ppAVar9;
  pointer ppPVar10;
  
  this_00 = this->skeleton;
  if (this_00 != (Skeleton *)0x0) {
    Skeleton::~Skeleton(this_00);
  }
  operator_delete(this_00,0x38);
  this->skeleton = (Skeleton *)0x0;
  this_01 = this->sharedVertexData;
  if (this_01 != (VertexData *)0x0) {
    VertexData::~VertexData(this_01);
  }
  operator_delete(this_01,200);
  this->sharedVertexData = (VertexData *)0x0;
  ppSVar8 = (this->subMeshes).
            super__Vector_base<Assimp::Ogre::SubMesh_*,_std::allocator<Assimp::Ogre::SubMesh_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppSVar2 = (this->subMeshes).
            super__Vector_base<Assimp::Ogre::SubMesh_*,_std::allocator<Assimp::Ogre::SubMesh_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppSVar8 != ppSVar2) {
    do {
      this_02 = *ppSVar8;
      if (this_02 != (SubMesh *)0x0) {
        SubMesh::~SubMesh(this_02);
      }
      operator_delete(this_02,0xa8);
      *ppSVar8 = (SubMesh *)0x0;
      ppSVar8 = ppSVar8 + 1;
    } while (ppSVar8 != ppSVar2);
    ppSVar8 = (this->subMeshes).
              super__Vector_base<Assimp::Ogre::SubMesh_*,_std::allocator<Assimp::Ogre::SubMesh_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((this->subMeshes).
        super__Vector_base<Assimp::Ogre::SubMesh_*,_std::allocator<Assimp::Ogre::SubMesh_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppSVar8) {
      (this->subMeshes).
      super__Vector_base<Assimp::Ogre::SubMesh_*,_std::allocator<Assimp::Ogre::SubMesh_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppSVar8;
    }
  }
  ppAVar9 = (this->animations).
            super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppAVar3 = (this->animations).
            super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppAVar9 != ppAVar3) {
    do {
      pAVar4 = *ppAVar9;
      if (pAVar4 != (Animation *)0x0) {
        std::
        vector<Assimp::Ogre::VertexAnimationTrack,_std::allocator<Assimp::Ogre::VertexAnimationTrack>_>
        ::~vector(&pAVar4->tracks);
        pcVar5 = (pAVar4->baseName)._M_dataplus._M_p;
        paVar1 = &(pAVar4->baseName).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar5 != paVar1) {
          operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
        }
        pcVar5 = (pAVar4->name)._M_dataplus._M_p;
        paVar1 = &(pAVar4->name).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar5 != paVar1) {
          operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
        }
      }
      operator_delete(pAVar4,0x70);
      *ppAVar9 = (Animation *)0x0;
      ppAVar9 = ppAVar9 + 1;
    } while (ppAVar9 != ppAVar3);
    ppAVar9 = (this->animations).
              super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->animations).
        super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppAVar9) {
      (this->animations).
      super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = ppAVar9;
    }
  }
  ppPVar10 = (this->poses).
             super__Vector_base<Assimp::Ogre::Pose_*,_std::allocator<Assimp::Ogre::Pose_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  ppPVar6 = (this->poses).
            super__Vector_base<Assimp::Ogre::Pose_*,_std::allocator<Assimp::Ogre::Pose_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppPVar10 != ppPVar6) {
    do {
      pPVar7 = *ppPVar10;
      if (pPVar7 != (Pose *)0x0) {
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Assimp::Ogre::Pose::Vertex>,_std::_Select1st<std::pair<const_unsigned_int,_Assimp::Ogre::Pose::Vertex>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::Ogre::Pose::Vertex>_>_>
        ::~_Rb_tree(&(pPVar7->vertices)._M_t);
        pcVar5 = (pPVar7->name)._M_dataplus._M_p;
        paVar1 = &(pPVar7->name).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar5 != paVar1) {
          operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
        }
      }
      operator_delete(pPVar7,0x58);
      *ppPVar10 = (Pose *)0x0;
      ppPVar10 = ppPVar10 + 1;
    } while (ppPVar10 != ppPVar6);
    ppPVar10 = (this->poses).
               super__Vector_base<Assimp::Ogre::Pose_*,_std::allocator<Assimp::Ogre::Pose_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if ((this->poses).
        super__Vector_base<Assimp::Ogre::Pose_*,_std::allocator<Assimp::Ogre::Pose_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppPVar10) {
      (this->poses).super__Vector_base<Assimp::Ogre::Pose_*,_std::allocator<Assimp::Ogre::Pose_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = ppPVar10;
    }
  }
  return;
}

Assistant:

void Mesh::Reset()
{
    OGRE_SAFE_DELETE(skeleton)
    OGRE_SAFE_DELETE(sharedVertexData)

    for(auto &mesh : subMeshes) {
        OGRE_SAFE_DELETE(mesh)
    }
    subMeshes.clear();
    for(auto &anim : animations) {
        OGRE_SAFE_DELETE(anim)
    }
    animations.clear();
    for(auto &pose : poses) {
        OGRE_SAFE_DELETE(pose)
    }
    poses.clear();
}